

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_analyze.cpp
# Opt level: O2

SharedExNdPtr __thiscall front::syntax::SyntaxAnalyze::gm_unary_exp(SyntaxAnalyze *this)

{
  undefined4 *puVar1;
  undefined4 uVar2;
  __shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2> *p_Var3;
  __shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2> *p_Var4;
  bool bVar5;
  int iVar6;
  ExpressNode *pEVar7;
  uint uVar8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var9;
  SyntaxAnalyze *in_RSI;
  string *psVar10;
  SharedExNdPtr SVar11;
  string num;
  SharedExNdPtr child;
  SharedExNdPtr tmp;
  string local_f8;
  __shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2> local_d8;
  __shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2> local_c8;
  __shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2> local_b8;
  __shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2> local_a8;
  __shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2> local_98;
  string local_88;
  string local_68;
  string local_48;
  
  *(undefined8 *)this = 0;
  this->matched_index = 0;
  bVar5 = try_word(in_RSI,1,LPARENT);
  if (bVar5) {
    match_one_word(in_RSI,LPARENT);
    gm_exp((SyntaxAnalyze *)&num);
    std::__shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2> *)this,
               (__shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2> *)&num);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&num._M_string_length);
    match_one_word(in_RSI,RPARENT);
    _Var9._M_pi = extraout_RDX;
    goto LAB_001830c7;
  }
  bVar5 = try_word(in_RSI,1,IDENFR);
  if (bVar5) {
    bVar5 = try_word(in_RSI,2,LPARENT);
    if (bVar5) {
      gm_func_call((SyntaxAnalyze *)&num);
    }
    else {
      gm_l_val((SyntaxAnalyze *)&num,(ValueMode)in_RSI);
    }
LAB_001830b2:
    std::__shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2> *)this,
               (__shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2> *)&num);
    psVar10 = &num;
  }
  else {
    bVar5 = try_word(in_RSI,1,INTCON);
    if (bVar5) {
      num._M_dataplus._M_p = (pointer)&num.field_2;
      num._M_string_length = 0;
      num.field_2._M_local_buf[0] = '\0';
      match_one_word(in_RSI,INTCON);
      word::Word::get_self_abi_cxx11_
                (&local_f8,
                 (in_RSI->word_list->
                 super__Vector_base<front::word::Word,_std::allocator<front::word::Word>_>)._M_impl.
                 super__Vector_impl_data._M_start + in_RSI->matched_index);
      std::__cxx11::string::operator=((string *)&num,(string *)&local_f8);
      std::__cxx11::string::~string((string *)&local_f8);
      pEVar7 = (ExpressNode *)operator_new(0x48);
      express::ExpressNode::ExpressNode(pEVar7);
      std::__shared_ptr<front::express::ExpressNode,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<front::express::ExpressNode,void>
                ((__shared_ptr<front::express::ExpressNode,(__gnu_cxx::_Lock_policy)2> *)&local_f8,
                 pEVar7);
      std::__shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2> *)this,
                 (__shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2> *)&local_f8)
      ;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_f8._M_string_length);
      std::__cxx11::string::string((string *)&local_88,(string *)&num);
      iVar6 = word::stringToInt(&local_88);
      *(int *)(*(long *)this + 8) = iVar6;
      std::__cxx11::string::~string((string *)&local_88);
      **(undefined8 **)this = 0x400000000;
      std::__cxx11::string::~string((string *)&num);
      _Var9._M_pi = extraout_RDX_00;
      goto LAB_001830c7;
    }
    pEVar7 = (ExpressNode *)operator_new(0x48);
    express::ExpressNode::ExpressNode(pEVar7);
    std::__shared_ptr<front::express::ExpressNode,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<front::express::ExpressNode,void>
              ((__shared_ptr<front::express::ExpressNode,(__gnu_cxx::_Lock_policy)2> *)&num,pEVar7);
    std::__shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2> *)this,
               (__shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2> *)&num);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&num._M_string_length);
    bVar5 = try_word(in_RSI,1,PLUS,MINU,NOT);
    if (!bVar5) {
      if (*(int *)(*(long *)this + 4) != 0x14) goto LAB_00183110;
LAB_001830a7:
      gm_unary_exp((SyntaxAnalyze *)&num);
      goto LAB_001830b2;
    }
    bVar5 = try_word(in_RSI,1,PLUS);
    if (bVar5) {
      match_one_word(in_RSI,PLUS);
      *(undefined4 *)(*(long *)this + 4) = 0x14;
      goto LAB_001830a7;
    }
    bVar5 = try_word(in_RSI,1,MINU);
    if (bVar5) {
      match_one_word(in_RSI,MINU);
      uVar2 = 0x15;
    }
    else {
      match_one_word(in_RSI,NOT);
      uVar2 = 0x16;
    }
    *(undefined4 *)(*(long *)this + 4) = uVar2;
LAB_00183110:
    gm_unary_exp((SyntaxAnalyze *)&child);
    if ((child.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        _type == CNS) {
      pEVar7 = *(ExpressNode **)this;
      pEVar7->_type = CNS;
      if (pEVar7->_operation == UN_MINU) {
        uVar8 = -(child.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->_value;
      }
      else {
        if (pEVar7->_operation != UN_NOT) goto LAB_00183307;
        uVar8 = (uint)((child.
                        super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr)->_value == 0);
      }
      pEVar7->_value = uVar8;
    }
    else {
      num._M_dataplus._M_p = (pointer)&num.field_2;
      num._M_string_length = 0;
      tmp.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      tmp.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      num.field_2._M_local_buf[0] = '\0';
      irGenerator::irGenerator::getNewTmpValueName_abi_cxx11_(&local_f8,&in_RSI->irGenerator,Int);
      std::__cxx11::string::operator=((string *)&num,(string *)&local_f8);
      std::__cxx11::string::~string((string *)&local_f8);
      puVar1 = *(undefined4 **)this;
      *puVar1 = 1;
      std::__cxx11::string::_M_assign((string *)(puVar1 + 4));
      pEVar7 = (ExpressNode *)operator_new(0x48);
      express::ExpressNode::ExpressNode(pEVar7);
      std::__shared_ptr<front::express::ExpressNode,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<front::express::ExpressNode,void>
                ((__shared_ptr<front::express::ExpressNode,(__gnu_cxx::_Lock_policy)2> *)&local_f8,
                 pEVar7);
      std::__shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>::operator=
                (&tmp.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>,
                 (__shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2> *)&local_f8)
      ;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_f8._M_string_length);
      (tmp.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      _type = CNS;
      (tmp.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      _operation = NUMBER;
      (tmp.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      _value = 0;
      if (*(int *)(*(long *)this + 4) == 0x15) {
        psVar10 = &local_48;
        std::__cxx11::string::string((string *)psVar10,(string *)&num);
        std::__shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_98,
                   &tmp.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>)
        ;
        std::__shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_a8,
                   &child.
                    super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>);
        hp_gn_binary_mir(in_RSI,psVar10,(SharedExNdPtr *)&local_98,(SharedExNdPtr *)&local_a8,Sub);
        p_Var3 = &local_a8;
        p_Var4 = &local_98;
      }
      else {
        psVar10 = &local_68;
        std::__cxx11::string::string((string *)psVar10,(string *)&num);
        std::__shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_b8,
                   &tmp.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>)
        ;
        std::__shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_c8,
                   &child.
                    super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>);
        hp_gn_binary_mir(in_RSI,psVar10,(SharedExNdPtr *)&local_b8,(SharedExNdPtr *)&local_c8,Eq);
        p_Var3 = &local_c8;
        p_Var4 = &local_b8;
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&p_Var3->_M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&p_Var4->_M_refcount);
      std::__cxx11::string::~string((string *)psVar10);
      std::__cxx11::string::~string((string *)&num);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&tmp.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      pEVar7 = *(ExpressNode **)this;
    }
LAB_00183307:
    std::__shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_d8,
               &child.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>);
    express::ExpressNode::addChild(pEVar7,(SharedExNdPtr *)&local_d8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_d8._M_refcount);
    psVar10 = (string *)&child;
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&psVar10->_M_string_length);
  _Var9._M_pi = extraout_RDX_01;
LAB_001830c7:
  SVar11.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var9._M_pi;
  SVar11.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (SharedExNdPtr)
         SVar11.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

SharedExNdPtr SyntaxAnalyze::gm_unary_exp() {
  SharedExNdPtr node;

  if (try_word(1, Token::LPARENT)) {
    match_one_word(Token::LPARENT);

    node = gm_exp();

    match_one_word(Token::RPARENT);
  } else if (try_word(1, Token::IDENFR)) {
    if (try_word(2, Token::LPARENT)) {
      node = gm_func_call();
    } else {
      node = gm_l_val(ValueMode::right);
    }
  } else if (try_word(1, Token::INTCON)) {
    string num;
    match_one_word(Token::INTCON);
    num = get_least_matched_word().get_self();
    node = SharedExNdPtr(new ExpressNode());
    node->_value = front::word::stringToInt(num);
    node->_type = NodeType::CNS;
    node->_operation = OperationType::NUMBER;
  } else {
    node = SharedExNdPtr(new ExpressNode());
    if (try_word(1, Token::PLUS, Token::MINU, Token::NOT)) {
      if (try_word(1, Token::PLUS)) {
        match_one_word(Token::PLUS);
        node->_operation = OperationType::UN_PLUS;
      } else if (try_word(1, Token::MINU)) {
        match_one_word(Token::MINU);
        node->_operation = OperationType::UN_MINU;
      } else {
        match_one_word(Token::NOT);
        node->_operation = OperationType::UN_NOT;
      }
    }

    if (node->_operation == OperationType::UN_PLUS) {
      node = gm_unary_exp();
    } else {
      SharedExNdPtr child = gm_unary_exp();

      if (child->_type == NodeType::CNS) {
        node->_type = NodeType::CNS;
        switch (node->_operation) {
          case OperationType::UN_MINU:
            node->_value = -child->_value;
            break;
          case OperationType::UN_NOT:
            node->_value = !child->_value;
            break;
          default:
            break;
        }
      } else {
        SharedExNdPtr tmp;
        string nodeId;

        nodeId = irGenerator.getNewTmpValueName(TyKind::Int);
        node->_type = NodeType::VAR;
        node->_name = nodeId;

        tmp = SharedExNdPtr(new ExpressNode());
        tmp->_type = NodeType::CNS;
        tmp->_operation = OperationType::NUMBER;
        tmp->_value = 0;

        if (node->_operation == OperationType::UN_MINU) {
          hp_gn_binary_mir(nodeId, tmp, child, Op::Sub);
        } else {
          hp_gn_binary_mir(nodeId, tmp, child, Op::Eq);
        }
      }
      node->addChild(child);
    }
  }
  return node;
}